

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::val
          (FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
           *this)

{
  long in_RSI;
  value_type *in_RDI;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *in_stack_ffffffffffffff88;
  value_type *this_00;
  Fad<double> *in_stack_ffffffffffffffc0;
  Fad<double> *in_stack_ffffffffffffffc8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffd8;
  Fad<double> *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>::val(in_stack_ffffffffffffff88);
  Fad<Fad<double>_>::val(*(Fad<Fad<double>_> **)(in_RSI + 8));
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Fad<double>::Fad<FadBinaryMul<Fad<double>,Fad<double>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}